

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O2

Frame * __thiscall Frame::reset(Frame *this,size_t newSize)

{
  pointer __p;
  pointer __p_00;
  stringstream stream;
  
  if (this->m_OriginalSize < newSize) {
    __p_00 = (pointer)operator_new__(newSize);
    this->m_OriginalSize = newSize;
    _stream = 0;
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)this,__p_00)
    ;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&stream);
  }
  this->m_Size = this->m_OriginalSize;
  this->m_Pos = (this->m_Data)._M_t.
                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + this->m_OriginalSize;
  return this;
}

Assistant:

Frame& Frame::reset(const size_t newSize)
{
    if (newSize > m_OriginalSize) {
        try {
            std::unique_ptr<uint8_t[]> tmp {new uint8_t[newSize]};
            m_OriginalSize = newSize;
            m_Data = std::move(tmp);
        } catch (const std::bad_alloc&) {
            LOG_WARN("Not enough memory to reset frame to " << std::dec << newSize << " bytes");
        }
    }

    m_Size = m_OriginalSize;
    m_Pos = m_Data.get() + m_Size;
    return *this;
}